

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureFilteringTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Accuracy::Texture2DFilteringCase::~Texture2DFilteringCase(Texture2DFilteringCase *this)

{
  ~Texture2DFilteringCase(this);
  operator_delete(this,0x128);
  return;
}

Assistant:

Texture2DFilteringCase::~Texture2DFilteringCase (void)
{
	deinit();
}